

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse(parser *this)

{
  int iVar1;
  uint uVar2;
  json_parser_exception *this_00;
  size_t byte_index;
  lexer *in_RSI;
  lexer l;
  lexer local_70;
  
  reader::reset_byte_index((reader *)in_RSI->_vptr_lexer);
  lexer::lexer(&local_70,(reader *)in_RSI->_vptr_lexer,*(size_t *)&in_RSI->m_last_put_back);
  parse_value(this,in_RSI,(size_t)&local_70);
  if (*(char *)&in_RSI->m_reader == '\x01') {
    do {
      iVar1 = (**(code **)(*in_RSI->_vptr_lexer + 0x10))();
      uVar2 = iVar1 + 1;
      if (0x21 < uVar2) goto LAB_0011a850;
    } while ((0x200004c00U >> ((ulong)uVar2 & 0x3f) & 1) != 0);
    if ((ulong)uVar2 != 0) {
LAB_0011a850:
      this_00 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
      byte_index = reader::get_byte_index((reader *)in_RSI->_vptr_lexer);
      json_parser_exception::json_parser_exception(this_00,invalid_character_e,byte_index);
      __cxa_throw(this_00,&json_parser_exception::typeinfo,std::exception::~exception);
    }
  }
  lexer::~lexer(&local_70);
  return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
}

Assistant:

unique_ptr<json> parser::parse()
{
    m_reader.reset_byte_index();

    lexer l(m_reader, m_max_token_length);

    auto res = parse_value(l, 0);

    if (m_read_all)
    {
        // check that there isn't anything other than whitespace left
        int c;

        while ((c = m_reader.next()) != EOF)
        {
            if ((c != 0x20) && (c != 0x09) && (c != 0x0A) && (c != 0x0D))
            {
                throw json_parser_exception(json_parser_exception::invalid_character_e, m_reader.get_byte_index());
            }
        }
    }
    return res;
}